

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O3

Id __thiscall
anon_unknown.dwarf_ddf01b::TGlslangToSpvTraverser::convertGlslangToSpvType
          (TGlslangToSpvTraverser *this,TType *type,bool forwardReferenceOnly)

{
  TLayoutPacking explicitLayout;
  int iVar1;
  Id IVar2;
  undefined4 extraout_var;
  
  explicitLayout = getExplicitLayout((TGlslangToSpvTraverser *)type,type);
  iVar1 = (*type->_vptr_TType[0xb])(type);
  IVar2 = convertGlslangToSpvType
                    (this,type,explicitLayout,(TQualifier *)CONCAT44(extraout_var,iVar1),false,false
                    );
  return IVar2;
}

Assistant:

spv::Id TGlslangToSpvTraverser::convertGlslangToSpvType(const glslang::TType& type, bool forwardReferenceOnly)
{
    return convertGlslangToSpvType(type, getExplicitLayout(type), type.getQualifier(), false, forwardReferenceOnly);
}